

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall
cmMakefile::AddRequiredTargetCxxFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  pointer pcVar1;
  cmake *this_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  cmTarget *pcVar5;
  char *__s;
  char **ppcVar6;
  char **ppcVar7;
  ostream *poVar8;
  size_t sVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool needCxx17;
  bool needCxx14;
  bool needCxx11;
  bool needCxx98;
  ostringstream e;
  byte local_29f;
  byte local_29e;
  bool local_29c;
  bool local_29b;
  bool local_29a;
  bool local_299;
  cmTarget *local_298;
  char **local_290;
  string local_288;
  long *local_268 [2];
  long local_258 [2];
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  undefined1 local_1e8 [112];
  ios_base local_178 [264];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_299 = false;
  local_29a = false;
  local_29b = false;
  local_29c = false;
  CheckNeededCxxLanguage(this,feature,&local_299,&local_29a,&local_29b,&local_29c);
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CXX_STANDARD","");
  __s = cmTarget::GetProperty(target,(string *)local_1e8);
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  local_298 = target;
  if (__s == (char *)0x0) {
    ppcVar6 = (char **)&cmMSVC60LinkLineComputer::vtable;
  }
  else {
    std::__cxx11::string::string((string *)local_50,__s,(allocator *)local_1e8);
    ppcVar6 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,(char **)&cmMSVC60LinkLineComputer::vtable,
                         (cmStrCmp *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (ppcVar6 == (char **)&cmMSVC60LinkLineComputer::vtable) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"The CXX_STANDARD property on target \"",0x25);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1e8,(local_298->Name)._M_dataplus._M_p,
                          (local_298->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"\" contained an invalid value: \"",0x1f);
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
      if (error == (string *)0x0) {
        this_00 = this->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(this_00,FATAL_ERROR,&local_288,&this->Backtrace);
      }
      else {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)error,(string *)&local_288);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
      std::ios_base::~ios_base(local_178);
      return false;
    }
    std::__cxx11::string::string((string *)local_70,__s,(allocator *)local_1e8);
    ppcVar6 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,(char **)&cmMSVC60LinkLineComputer::vtable,
                         (cmStrCmp *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  bVar4 = local_299;
  bVar3 = local_29a;
  bVar11 = local_29b;
  bVar2 = local_29c;
  bVar12 = __s == (char *)0x0;
  if ((!bVar12 & local_29c) == 1) {
    local_248[0] = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"17","");
    ppcVar7 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,(char **)&cmMSVC60LinkLineComputer::vtable,
                         (cmStrCmp *)local_248);
    if (local_248[0] != local_238) {
      operator_delete(local_248[0],local_238[0] + 1);
    }
    if (ppcVar7 <= ppcVar6) goto LAB_0036cdf4;
  }
  else {
LAB_0036cdf4:
    local_29f = bVar12 & bVar4;
    local_29e = bVar12 & bVar3;
    if (__s == (char *)0x0 || bVar11 != true) {
LAB_0036ce87:
      bVar10 = bVar12 & bVar11;
      if (__s != (char *)0x0 && bVar3 == true) {
        local_208[0] = local_1f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"11","");
        ppcVar7 = std::find_if<char_const*const*,cmStrCmp>
                            (CXX_STANDARDS,(char **)&cmMSVC60LinkLineComputer::vtable,
                             (cmStrCmp *)local_208);
        if (local_208[0] != local_1f8) {
          operator_delete(local_208[0],local_1f8[0] + 1);
        }
        if (ppcVar6 < ppcVar7) {
          local_29e = 1;
          goto LAB_0036cf0d;
        }
      }
      if (__s == (char *)0x0 || bVar4 != true) {
        bVar11 = false;
      }
      else {
        local_228[0] = local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"98","");
        ppcVar7 = std::find_if<char_const*const*,cmStrCmp>
                            (CXX_STANDARDS,(char **)&cmMSVC60LinkLineComputer::vtable,
                             (cmStrCmp *)local_228);
        bVar11 = ppcVar6 < ppcVar7;
        if (local_228[0] != local_218) {
          operator_delete(local_228[0],local_218[0] + 1);
        }
      }
      if ((bVar2 & bVar12) == 0) {
        local_29f = bVar11 | local_29f;
        goto LAB_0036d107;
      }
    }
    else {
      local_268[0] = local_258;
      local_290 = ppcVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"14","");
      ppcVar7 = std::find_if<char_const*const*,cmStrCmp>
                          (CXX_STANDARDS,(char **)&cmMSVC60LinkLineComputer::vtable,
                           (cmStrCmp *)local_268);
      if (local_268[0] != local_258) {
        operator_delete(local_268[0],local_258[0] + 1);
      }
      bVar10 = 1;
      ppcVar6 = local_290;
      if (ppcVar7 <= local_290) goto LAB_0036ce87;
LAB_0036cf0d:
      if ((bVar2 & bVar12) == 0) {
LAB_0036d107:
        pcVar5 = local_298;
        if (bVar10 == 0) {
          pcVar1 = local_1e8 + 0x10;
          local_1e8._0_8_ = pcVar1;
          if (local_29e == 0) {
            if (local_29f == 0) {
              return true;
            }
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CXX_STANDARD","");
            cmTarget::SetProperty(pcVar5,(string *)local_1e8,"98");
            if ((pointer)local_1e8._0_8_ != pcVar1) {
              operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
            }
            local_1e8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CUDA_STANDARD","");
            cmTarget::SetProperty(pcVar5,(string *)local_1e8,"98");
            if ((pointer)local_1e8._0_8_ == pcVar1) {
              return true;
            }
            operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
            return true;
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CXX_STANDARD","");
          cmTarget::SetProperty(pcVar5,(string *)local_1e8,"11");
          if ((pointer)local_1e8._0_8_ != pcVar1) {
            operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
          }
          local_1e8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CUDA_STANDARD","");
          cmTarget::SetProperty(pcVar5,(string *)local_1e8,"11");
        }
        else {
          pcVar1 = local_1e8 + 0x10;
          local_1e8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CXX_STANDARD","");
          pcVar5 = local_298;
          cmTarget::SetProperty(local_298,(string *)local_1e8,"14");
          if ((pointer)local_1e8._0_8_ != pcVar1) {
            operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
          }
          local_1e8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CUDA_STANDARD","");
          cmTarget::SetProperty(pcVar5,(string *)local_1e8,"14");
        }
        goto LAB_0036d248;
      }
    }
  }
  pcVar1 = local_1e8 + 0x10;
  local_1e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CXX_STANDARD","");
  pcVar5 = local_298;
  cmTarget::SetProperty(local_298,(string *)local_1e8,"17");
  if ((pointer)local_1e8._0_8_ != pcVar1) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  local_1e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CUDA_STANDARD","");
  cmTarget::SetProperty(pcVar5,(string *)local_1e8,"17");
LAB_0036d248:
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  return true;
}

Assistant:

bool cmMakefile::AddRequiredTargetCxxFeature(cmTarget* target,
                                             const std::string& feature,
                                             std::string* error) const
{
  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;
  bool needCxx17 = false;

  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14,
                               needCxx17);

  const char* existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (existingCxxStandard) {
    if (std::find_if(cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS),
                     cmStrCmp(existingCxxStandard)) ==
        cmArrayEnd(CXX_STANDARDS)) {
      std::ostringstream e;
      e << "The CXX_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                               this->Backtrace);
      }
      return false;
    }
  }
  const char* const* existingCxxIt = existingCxxStandard
    ? std::find_if(cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS),
                   cmStrCmp(existingCxxStandard))
    : cmArrayEnd(CXX_STANDARDS);

  bool setCxx98 = needCxx98 && !existingCxxStandard;
  bool setCxx11 = needCxx11 && !existingCxxStandard;
  bool setCxx14 = needCxx14 && !existingCxxStandard;
  bool setCxx17 = needCxx17 && !existingCxxStandard;

  if (needCxx17 && existingCxxStandard &&
      existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                   cmArrayEnd(CXX_STANDARDS),
                                   cmStrCmp("17"))) {
    setCxx17 = true;
  } else if (needCxx14 && existingCxxStandard &&
             existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                          cmArrayEnd(CXX_STANDARDS),
                                          cmStrCmp("14"))) {
    setCxx14 = true;
  } else if (needCxx11 && existingCxxStandard &&
             existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                          cmArrayEnd(CXX_STANDARDS),
                                          cmStrCmp("11"))) {
    setCxx11 = true;
  } else if (needCxx98 && existingCxxStandard &&
             existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                          cmArrayEnd(CXX_STANDARDS),
                                          cmStrCmp("98"))) {
    setCxx98 = true;
  }

  if (setCxx17) {
    target->SetProperty("CXX_STANDARD", "17");
    target->SetProperty("CUDA_STANDARD", "17");
  } else if (setCxx14) {
    target->SetProperty("CXX_STANDARD", "14");
    target->SetProperty("CUDA_STANDARD", "14");
  } else if (setCxx11) {
    target->SetProperty("CXX_STANDARD", "11");
    target->SetProperty("CUDA_STANDARD", "11");
  } else if (setCxx98) {
    target->SetProperty("CXX_STANDARD", "98");
    target->SetProperty("CUDA_STANDARD", "98");
  }
  return true;
}